

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O0

ArrayRef<llvm::dwarf::CFIProgram::OperandType[2]> llvm::dwarf::CFIProgram::getOperandTypes(void)

{
  ArrayRef<llvm::dwarf::CFIProgram::OperandType[2]> local_18;
  
  if (getOperandTypes::Initialized) {
    ArrayRef<llvm::dwarf::CFIProgram::OperandType[2]>::ArrayRef
              (&local_18,getOperandTypes::OpTypes,0xc1);
  }
  else {
    getOperandTypes::Initialized = true;
    getOperandTypes::OpTypes[1][0] = OT_Address;
    getOperandTypes::OpTypes[1][1] = OT_None;
    getOperandTypes::OpTypes[0x40][0] = OT_FactoredCodeOffset;
    getOperandTypes::OpTypes[0x40][1] = OT_None;
    getOperandTypes::OpTypes[2][0] = OT_FactoredCodeOffset;
    getOperandTypes::OpTypes[2][1] = OT_None;
    getOperandTypes::OpTypes[3][0] = OT_FactoredCodeOffset;
    getOperandTypes::OpTypes[3][1] = OT_None;
    getOperandTypes::OpTypes[4][0] = OT_FactoredCodeOffset;
    getOperandTypes::OpTypes[4][1] = OT_None;
    getOperandTypes::OpTypes[0x1d][0] = OT_FactoredCodeOffset;
    getOperandTypes::OpTypes[0x1d][1] = OT_None;
    getOperandTypes::OpTypes[0xc][0] = OT_Register;
    getOperandTypes::OpTypes[0xc][1] = OT_Offset;
    getOperandTypes::OpTypes[0x12][0] = OT_Register;
    getOperandTypes::OpTypes[0x12][1] = OT_SignedFactDataOffset;
    getOperandTypes::OpTypes[0xd][0] = OT_Register;
    getOperandTypes::OpTypes[0xd][1] = OT_None;
    getOperandTypes::OpTypes[0xe][0] = OT_Offset;
    getOperandTypes::OpTypes[0xe][1] = OT_None;
    getOperandTypes::OpTypes[0x13][0] = OT_SignedFactDataOffset;
    getOperandTypes::OpTypes[0x13][1] = OT_None;
    getOperandTypes::OpTypes[0xf][0] = OT_Expression;
    getOperandTypes::OpTypes[0xf][1] = OT_None;
    getOperandTypes::OpTypes[7][0] = OT_Register;
    getOperandTypes::OpTypes[7][1] = OT_None;
    getOperandTypes::OpTypes[8][0] = OT_Register;
    getOperandTypes::OpTypes[8][1] = OT_None;
    getOperandTypes::OpTypes[0x80][0] = OT_Register;
    getOperandTypes::OpTypes[0x80][1] = OT_UnsignedFactDataOffset;
    getOperandTypes::OpTypes[5][0] = OT_Register;
    getOperandTypes::OpTypes[5][1] = OT_UnsignedFactDataOffset;
    getOperandTypes::OpTypes[0x11][0] = OT_Register;
    getOperandTypes::OpTypes[0x11][1] = OT_SignedFactDataOffset;
    getOperandTypes::OpTypes[0x14][0] = OT_Register;
    getOperandTypes::OpTypes[0x14][1] = OT_UnsignedFactDataOffset;
    getOperandTypes::OpTypes[0x15][0] = OT_Register;
    getOperandTypes::OpTypes[0x15][1] = OT_SignedFactDataOffset;
    getOperandTypes::OpTypes[9][0] = OT_Register;
    getOperandTypes::OpTypes[9][1] = OT_Register;
    getOperandTypes::OpTypes[0x10][0] = OT_Register;
    getOperandTypes::OpTypes[0x10][1] = OT_Expression;
    getOperandTypes::OpTypes[0x16][0] = OT_Register;
    getOperandTypes::OpTypes[0x16][1] = OT_Expression;
    getOperandTypes::OpTypes[0xc0][0] = OT_Register;
    getOperandTypes::OpTypes[0xc0][1] = OT_None;
    getOperandTypes::OpTypes[6][0] = OT_Register;
    getOperandTypes::OpTypes[6][1] = OT_None;
    getOperandTypes::OpTypes[10][0] = OT_None;
    getOperandTypes::OpTypes[10][1] = OT_None;
    getOperandTypes::OpTypes[0xb][0] = OT_None;
    getOperandTypes::OpTypes[0xb][1] = OT_None;
    getOperandTypes::OpTypes[0x2d][0] = OT_None;
    getOperandTypes::OpTypes[0x2d][1] = OT_None;
    getOperandTypes::OpTypes[0x2e][0] = OT_Offset;
    getOperandTypes::OpTypes[0x2e][1] = OT_None;
    getOperandTypes::OpTypes[0][0] = OT_None;
    getOperandTypes::OpTypes[0][1] = OT_None;
    ArrayRef<llvm::dwarf::CFIProgram::OperandType[2]>::ArrayRef
              (&local_18,getOperandTypes::OpTypes,0xc1);
  }
  return local_18;
}

Assistant:

ArrayRef<CFIProgram::OperandType[2]> CFIProgram::getOperandTypes() {
  static OperandType OpTypes[DW_CFA_restore+1][2];
  static bool Initialized = false;
  if (Initialized) {
    return ArrayRef<OperandType[2]>(&OpTypes[0], DW_CFA_restore+1);
  }
  Initialized = true;

#define DECLARE_OP2(OP, OPTYPE0, OPTYPE1)       \
  do {                                          \
    OpTypes[OP][0] = OPTYPE0;                   \
    OpTypes[OP][1] = OPTYPE1;                   \
  } while (false)
#define DECLARE_OP1(OP, OPTYPE0) DECLARE_OP2(OP, OPTYPE0, OT_None)
#define DECLARE_OP0(OP) DECLARE_OP1(OP, OT_None)

  DECLARE_OP1(DW_CFA_set_loc, OT_Address);
  DECLARE_OP1(DW_CFA_advance_loc, OT_FactoredCodeOffset);
  DECLARE_OP1(DW_CFA_advance_loc1, OT_FactoredCodeOffset);
  DECLARE_OP1(DW_CFA_advance_loc2, OT_FactoredCodeOffset);
  DECLARE_OP1(DW_CFA_advance_loc4, OT_FactoredCodeOffset);
  DECLARE_OP1(DW_CFA_MIPS_advance_loc8, OT_FactoredCodeOffset);
  DECLARE_OP2(DW_CFA_def_cfa, OT_Register, OT_Offset);
  DECLARE_OP2(DW_CFA_def_cfa_sf, OT_Register, OT_SignedFactDataOffset);
  DECLARE_OP1(DW_CFA_def_cfa_register, OT_Register);
  DECLARE_OP1(DW_CFA_def_cfa_offset, OT_Offset);
  DECLARE_OP1(DW_CFA_def_cfa_offset_sf, OT_SignedFactDataOffset);
  DECLARE_OP1(DW_CFA_def_cfa_expression, OT_Expression);
  DECLARE_OP1(DW_CFA_undefined, OT_Register);
  DECLARE_OP1(DW_CFA_same_value, OT_Register);
  DECLARE_OP2(DW_CFA_offset, OT_Register, OT_UnsignedFactDataOffset);
  DECLARE_OP2(DW_CFA_offset_extended, OT_Register, OT_UnsignedFactDataOffset);
  DECLARE_OP2(DW_CFA_offset_extended_sf, OT_Register, OT_SignedFactDataOffset);
  DECLARE_OP2(DW_CFA_val_offset, OT_Register, OT_UnsignedFactDataOffset);
  DECLARE_OP2(DW_CFA_val_offset_sf, OT_Register, OT_SignedFactDataOffset);
  DECLARE_OP2(DW_CFA_register, OT_Register, OT_Register);
  DECLARE_OP2(DW_CFA_expression, OT_Register, OT_Expression);
  DECLARE_OP2(DW_CFA_val_expression, OT_Register, OT_Expression);
  DECLARE_OP1(DW_CFA_restore, OT_Register);
  DECLARE_OP1(DW_CFA_restore_extended, OT_Register);
  DECLARE_OP0(DW_CFA_remember_state);
  DECLARE_OP0(DW_CFA_restore_state);
  DECLARE_OP0(DW_CFA_GNU_window_save);
  DECLARE_OP1(DW_CFA_GNU_args_size, OT_Offset);
  DECLARE_OP0(DW_CFA_nop);

#undef DECLARE_OP0
#undef DECLARE_OP1
#undef DECLARE_OP2

  return ArrayRef<OperandType[2]>(&OpTypes[0], DW_CFA_restore+1);
}